

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O0

void Ssw_ManCollectPos_rec(Ssw_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vNewPos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_48;
  int local_30;
  int local_2c;
  int i;
  int iFanout;
  Aig_Obj_t *pFanout;
  Vec_Int_t *vNewPos_local;
  Aig_Obj_t *pObj_local;
  Ssw_Man_t *p_local;
  
  local_2c = -1;
  iVar2 = Aig_IsComplement(pObj);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswDyn.c"
                  ,0x6b,"void Ssw_ManCollectPos_rec(Ssw_Man_t *, Aig_Obj_t *, Vec_Int_t *)");
  }
  if (((*(ulong *)&pObj->field_0x18 >> 5 & 1) == 0) &&
     (*(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf | 0x20,
     pObj->Id <= p->nSRMiterMaxId)) {
    iVar2 = Aig_ObjIsCo(pObj);
    if (iVar2 == 0) {
      if (p->pFrames->pFanData == (int *)0x0) {
        __assert_fail("p->pFrames->pFanData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswDyn.c"
                      ,0x7b,"void Ssw_ManCollectPos_rec(Ssw_Man_t *, Aig_Obj_t *, Vec_Int_t *)");
      }
      if (p->pFrames->pFanData == (int *)0x0) {
        __assert_fail("p->pFrames->pFanData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswDyn.c"
                      ,0x7c,"void Ssw_ManCollectPos_rec(Ssw_Man_t *, Aig_Obj_t *, Vec_Int_t *)");
      }
      local_30 = 0;
      while( true ) {
        bVar1 = false;
        if (local_30 < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
          if (local_30 == 0) {
            local_48 = Aig_ObjFanout0Int(p->pFrames,pObj->Id);
          }
          else {
            local_48 = Aig_ObjFanoutNext(p->pFrames,local_2c);
          }
          local_2c = local_48;
          _i = Aig_ManObj(p->pFrames,local_48 >> 1);
          bVar1 = true;
        }
        if (!bVar1) break;
        Ssw_ManCollectPos_rec(p,_i,vNewPos);
        local_30 = local_30 + 1;
      }
    }
    else {
      iVar2 = Aig_ObjCioId(pObj);
      iVar3 = Aig_ManCoNum(p->pFrames);
      iVar4 = Aig_ManRegNum(p->pAig);
      if (iVar2 < iVar3 - iVar4) {
        iVar2 = Aig_ObjCioId(pObj);
        Vec_IntPush(vNewPos,iVar2 / 2);
      }
    }
  }
  return;
}

Assistant:

void Ssw_ManCollectPos_rec( Ssw_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vNewPos )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    assert( !Aig_IsComplement(pObj) );
    if ( pObj->fMarkB )
        return;
    pObj->fMarkB = 1;
    if ( pObj->Id > p->nSRMiterMaxId )
        return;
    if ( Aig_ObjIsCo(pObj) )
    {
        // skip if it is a register input PO
        if ( Aig_ObjCioId(pObj) >= Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig) )
            return;
        // add the number of this constraint
        Vec_IntPush( vNewPos, Aig_ObjCioId(pObj)/2 );
        return;
    }
    // visit the fanouts
    assert( p->pFrames->pFanData != NULL );
    Aig_ObjForEachFanout( p->pFrames, pObj, pFanout, iFanout, i )
        Ssw_ManCollectPos_rec( p, pFanout, vNewPos );
}